

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawElementsBaseVertexTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_0::MethodGroup::init(MethodGroup *this,EVP_PKEY_CTX *ctx)

{
  DrawMethod DVar1;
  uint uVar2;
  Context *pCVar3;
  TestNode *pTVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  Primitive primitive;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  long lVar6;
  string desc;
  string name;
  string local_70;
  string local_50;
  
  DVar1 = this->m_method;
  if (DVar1 - DRAWMETHOD_DRAWELEMENTS_BASEVERTEX < 3) {
    pTVar4 = (TestNode *)operator_new(0x80);
    pCVar3 = (this->super_TestCaseGroup).m_context;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,pCVar3->m_testCtx,"indices","Index tests");
    pTVar4[1]._vptr_TestNode = (_func_int **)pCVar3;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_021b85d0;
    *(DrawMethod *)&pTVar4[1].m_testCtx = DVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar4);
    pTVar4 = (TestNode *)operator_new(0x80);
    pCVar3 = (this->super_TestCaseGroup).m_context;
    DVar1 = this->m_method;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,pCVar3->m_testCtx,"base_vertex","Base vertex tests");
    pTVar4[1]._vptr_TestNode = (_func_int **)pCVar3;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_021b8620;
    *(DrawMethod *)&pTVar4[1].m_testCtx = DVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar4);
    pTVar4 = (TestNode *)operator_new(0x80);
    pCVar3 = (this->super_TestCaseGroup).m_context;
    DVar1 = this->m_method;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,pCVar3->m_testCtx,"builtin_variable",
               "Built in shader variable tests");
    pTVar4[1]._vptr_TestNode = (_func_int **)pCVar3;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_021b8670;
    *(DrawMethod *)&pTVar4[1].m_testCtx = DVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar4);
    in_RDX = extraout_RDX;
  }
  lVar6 = 0;
  do {
    uVar2 = *(uint *)((long)&DAT_01cd6290 + lVar6);
    deqp::gls::DrawTestSpec::primitiveToString_abi_cxx11_
              (&local_50,(DrawTestSpec *)(ulong)uVar2,(Primitive)in_RDX);
    deqp::gls::DrawTestSpec::primitiveToString_abi_cxx11_
              (&local_70,(DrawTestSpec *)(ulong)uVar2,primitive);
    pTVar4 = (TestNode *)operator_new(0x88);
    pCVar3 = (this->super_TestCaseGroup).m_context;
    DVar1 = this->m_method;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,pCVar3->m_testCtx,local_50._M_dataplus._M_p,
               local_70._M_dataplus._M_p);
    pTVar4[1]._vptr_TestNode = (_func_int **)pCVar3;
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_021b8710;
    *(DrawMethod *)&pTVar4[1].m_testCtx = DVar1;
    *(uint *)((long)&pTVar4[1].m_testCtx + 4) = uVar2;
    pTVar4[1].m_name._M_dataplus._M_p = &DAT_100000001;
    tcu::TestNode::addChild((TestNode *)this,pTVar4);
    in_RDX = extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      in_RDX = extraout_RDX_01;
    }
    paVar5 = &local_50.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar5) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      paVar5 = extraout_RAX;
      in_RDX = extraout_RDX_02;
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x1c);
  return (int)paVar5;
}

Assistant:

void MethodGroup::init (void)
{
	const bool indexed		=	(m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_BASEVERTEX)
							||	(m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX)
							||	(m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INSTANCED_BASEVERTEX);

	const gls::DrawTestSpec::Primitive primitive[] =
	{
		gls::DrawTestSpec::PRIMITIVE_POINTS,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLES,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINES,
		gls::DrawTestSpec::PRIMITIVE_LINE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINE_LOOP
	};

	if (indexed)
	{
		// Index-tests
		this->addChild(new IndexGroup(m_context, "indices", "Index tests", m_method));
		this->addChild(new BaseVertexGroup(m_context, "base_vertex", "Base vertex tests", m_method));
		this->addChild(new BuiltInVariableGroup(m_context, "builtin_variable", "Built in shader variable tests", m_method));
	}

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(primitive); ++ndx)
	{
		const std::string name = gls::DrawTestSpec::primitiveToString(primitive[ndx]);
		const std::string desc = gls::DrawTestSpec::primitiveToString(primitive[ndx]);

		this->addChild(new AttributeGroup(m_context, name.c_str(), desc.c_str(), m_method, primitive[ndx], gls::DrawTestSpec::INDEXTYPE_SHORT, gls::DrawTestSpec::STORAGE_BUFFER));
	}
}